

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTotalsDivider(ConsoleReporter *this,Totals *totals)

{
  size_t sVar1;
  bool bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  size_t *psVar5;
  ColourImpl *pCVar6;
  ostream *poVar7;
  allocator<char> local_191;
  string local_190 [32];
  ColourGuard local_170;
  allocator<char> local_159;
  string local_158 [32];
  ColourGuard local_138;
  allocator<char> local_121;
  string local_120 [32];
  ColourGuard local_100;
  allocator<char> local_e9;
  string local_e8 [32];
  ColourGuard local_c8;
  allocator<char> local_b1;
  string local_b0 [32];
  ColourGuard local_90;
  allocator<char> local_79;
  string local_78 [48];
  ColourGuard local_48;
  size_t local_38;
  size_t skippedRatio;
  size_t passedRatio;
  size_t failedButOkRatio;
  size_t failedRatio;
  Totals *totals_local;
  ConsoleReporter *this_local;
  
  failedRatio = (size_t)totals;
  totals_local = (Totals *)this;
  uVar3 = Counts::total(&totals->testCases);
  if (uVar3 == 0) {
    poVar7 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    pCVar6 = Detail::unique_ptr<Catch::ColourImpl>::operator->
                       (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
    ColourImpl::guardColour((ColourImpl *)&local_170,(Code)pCVar6);
    poVar7 = Catch::operator<<(poVar7,&local_170);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_190,0x4f,'=',&local_191);
    std::operator<<(poVar7,local_190);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator(&local_191);
    ColourImpl::ColourGuard::~ColourGuard(&local_170);
  }
  else {
    uVar3 = *(uint64_t *)(failedRatio + 0x28);
    uVar4 = Counts::total((Counts *)(failedRatio + 0x20));
    failedButOkRatio = anon_unknown_26::makeRatio(uVar3,uVar4);
    uVar3 = *(uint64_t *)(failedRatio + 0x30);
    uVar4 = Counts::total((Counts *)(failedRatio + 0x20));
    passedRatio = anon_unknown_26::makeRatio(uVar3,uVar4);
    uVar3 = *(uint64_t *)(failedRatio + 0x20);
    uVar4 = Counts::total((Counts *)(failedRatio + 0x20));
    skippedRatio = anon_unknown_26::makeRatio(uVar3,uVar4);
    uVar3 = *(uint64_t *)(failedRatio + 0x38);
    uVar4 = Counts::total((Counts *)(failedRatio + 0x20));
    local_38 = anon_unknown_26::makeRatio(uVar3,uVar4);
    while (failedButOkRatio + passedRatio + skippedRatio + local_38 < 0x4f) {
      psVar5 = anon_unknown_26::findMax(&failedButOkRatio,&passedRatio,&skippedRatio,&local_38);
      *psVar5 = *psVar5 + 1;
    }
    while (0x4f < failedButOkRatio + passedRatio + skippedRatio) {
      psVar5 = anon_unknown_26::findMax(&failedButOkRatio,&passedRatio,&skippedRatio,&local_38);
      *psVar5 = *psVar5 - 1;
    }
    poVar7 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    pCVar6 = Detail::unique_ptr<Catch::ColourImpl>::operator->
                       (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
    ColourImpl::guardColour((ColourImpl *)&local_48,(Code)pCVar6);
    poVar7 = Catch::operator<<(poVar7,&local_48);
    sVar1 = failedButOkRatio;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_78,sVar1,'=',&local_79);
    poVar7 = std::operator<<(poVar7,local_78);
    pCVar6 = Detail::unique_ptr<Catch::ColourImpl>::operator->
                       (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
    ColourImpl::guardColour((ColourImpl *)&local_90,(Code)pCVar6);
    poVar7 = Catch::operator<<(poVar7,&local_90);
    sVar1 = passedRatio;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b0,sVar1,'=',&local_b1);
    std::operator<<(poVar7,local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator(&local_b1);
    ColourImpl::ColourGuard::~ColourGuard(&local_90);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    ColourImpl::ColourGuard::~ColourGuard(&local_48);
    bVar2 = Counts::allPassed((Counts *)(failedRatio + 0x20));
    if (bVar2) {
      poVar7 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
      pCVar6 = Detail::unique_ptr<Catch::ColourImpl>::operator->
                         (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
      ColourImpl::guardColour((ColourImpl *)&local_c8,(Code)pCVar6);
      poVar7 = Catch::operator<<(poVar7,&local_c8);
      sVar1 = skippedRatio;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_e8,sVar1,'=',&local_e9);
      std::operator<<(poVar7,local_e8);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator(&local_e9);
      ColourImpl::ColourGuard::~ColourGuard(&local_c8);
    }
    else {
      poVar7 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
      pCVar6 = Detail::unique_ptr<Catch::ColourImpl>::operator->
                         (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
      ColourImpl::guardColour((ColourImpl *)&local_100,(Code)pCVar6);
      poVar7 = Catch::operator<<(poVar7,&local_100);
      sVar1 = skippedRatio;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_120,sVar1,'=',&local_121);
      std::operator<<(poVar7,local_120);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator(&local_121);
      ColourImpl::ColourGuard::~ColourGuard(&local_100);
    }
    poVar7 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    pCVar6 = Detail::unique_ptr<Catch::ColourImpl>::operator->
                       (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
    ColourImpl::guardColour((ColourImpl *)&local_138,(Code)pCVar6);
    poVar7 = Catch::operator<<(poVar7,&local_138);
    sVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_158,sVar1,'=',&local_159);
    std::operator<<(poVar7,local_158);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator(&local_159);
    ColourImpl::ColourGuard::~ColourGuard(&local_138);
  }
  std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,'\n');
  return;
}

Assistant:

void ConsoleReporter::printTotalsDivider(Totals const& totals) {
    if (totals.testCases.total() > 0) {
        std::size_t failedRatio = makeRatio(totals.testCases.failed, totals.testCases.total());
        std::size_t failedButOkRatio = makeRatio(totals.testCases.failedButOk, totals.testCases.total());
        std::size_t passedRatio = makeRatio(totals.testCases.passed, totals.testCases.total());
        std::size_t skippedRatio = makeRatio(totals.testCases.skipped, totals.testCases.total());
        while (failedRatio + failedButOkRatio + passedRatio + skippedRatio < CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio, skippedRatio)++;
        while (failedRatio + failedButOkRatio + passedRatio > CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio, skippedRatio)--;

        m_stream << m_colour->guardColour( Colour::Error )
                 << std::string( failedRatio, '=' )
                 << m_colour->guardColour( Colour::ResultExpectedFailure )
                 << std::string( failedButOkRatio, '=' );
        if ( totals.testCases.allPassed() ) {
            m_stream << m_colour->guardColour( Colour::ResultSuccess )
                     << std::string( passedRatio, '=' );
        } else {
            m_stream << m_colour->guardColour( Colour::Success )
                     << std::string( passedRatio, '=' );
        }
        m_stream << m_colour->guardColour( Colour::Skip )
                 << std::string( skippedRatio, '=' );
    } else {
        m_stream << m_colour->guardColour( Colour::Warning )
                 << std::string( CATCH_CONFIG_CONSOLE_WIDTH - 1, '=' );
    }
    m_stream << '\n';
}